

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.cpp
# Opt level: O0

int diff(int argc,char **argv)

{
  char *pcVar1;
  vector<DiffLine,_std::allocator<DiffLine>_> local_1b8;
  string local_1a0 [32];
  string local_180 [32];
  undefined1 local_160 [8];
  vector<DiffLine,_std::allocator<DiffLine>_> diff_lines;
  vector<FileStatus,_std::allocator<FileStatus>_> local_130;
  string local_110 [32];
  string local_f0 [32];
  undefined1 local_d0 [8];
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  string local_b0 [32];
  string local_90 [8];
  string old_dir;
  allocator local_59;
  string local_58 [32];
  string local_38 [8];
  string new_dir;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("diff need 2 or more arguments\n");
    exit(1);
  }
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  hashToDir(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,pcVar1,
             (allocator *)
             ((long)&status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  hashToDir(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  if (argc < 3) {
    std::__cxx11::string::string(local_f0,(string *)local_38);
    std::__cxx11::string::string(local_110,(string *)local_90);
    diffStatus((vector<FileStatus,_std::allocator<FileStatus>_> *)local_d0,(string *)local_f0,
               (string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_f0);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::vector
              ((vector<FileStatus,_std::allocator<FileStatus>_> *)
               &diff_lines.super__Vector_base<DiffLine,_std::allocator<DiffLine>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<FileStatus,_std::allocator<FileStatus>_> *)local_d0);
    strStatus_abi_cxx11_(&local_130);
    std::operator<<((ostream *)&std::cout,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector
              ((vector<FileStatus,_std::allocator<FileStatus>_> *)
               &diff_lines.super__Vector_base<DiffLine,_std::allocator<DiffLine>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector
              ((vector<FileStatus,_std::allocator<FileStatus>_> *)local_d0);
  }
  else {
    std::__cxx11::string::operator+=((string *)local_38,"/");
    std::__cxx11::string::operator+=((string *)local_38,argv[2]);
    std::__cxx11::string::operator+=((string *)local_90,"/");
    std::__cxx11::string::operator+=((string *)local_90,argv[2]);
    std::__cxx11::string::string(local_180,(string *)local_38);
    std::__cxx11::string::string(local_1a0,(string *)local_90);
    diff_files((vector<DiffLine,_std::allocator<DiffLine>_> *)local_160,(string *)local_180,
               (string *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_180);
    std::vector<DiffLine,_std::allocator<DiffLine>_>::vector
              (&local_1b8,(vector<DiffLine,_std::allocator<DiffLine>_> *)local_160);
    printDiffLines(&local_1b8);
    std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&local_1b8);
    std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
              ((vector<DiffLine,_std::allocator<DiffLine>_> *)local_160);
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int diff(int argc, char *argv[]){
    if(argc < 2){
        printf("diff need 2 or more arguments\n");
        exit(EXIT_FAILURE);
    }
    String new_dir = hashToDir(argv[0]);
    String old_dir = hashToDir(argv[1]);
    if (argc < 3){
        Vector<FileStatus> status = diffStatus(new_dir, old_dir);
        Cout << strStatus(status);
    } else{
        new_dir += "/";
        new_dir += argv[2];
        old_dir += "/";
        old_dir += argv[2];
        Vector<DiffLine> diff_lines = diff_files(new_dir,old_dir);
        printDiffLines(diff_lines);
    }
    return 0;
}